

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O3

ngram_model_t *
ngram_model_set_add(ngram_model_t *base,ngram_model_t *model,char *name,float32 weight,
                   int reuse_widmap)

{
  int *piVar1;
  int iVar2;
  int32 iVar3;
  uint32 *puVar4;
  void *pvVar5;
  char *pcVar6;
  logmath_t *plVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  iVar8 = base[1].refcount;
  base[1].refcount = iVar8 + 1;
  puVar4 = (uint32 *)
           __ckd_realloc__(base[1].n_counts,(long)iVar8 * 8 + 8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x217);
  base[1].n_counts = puVar4;
  iVar8 = base[1].refcount;
  *(ngram_model_t **)(puVar4 + (long)iVar8 * 2 + -2) = model;
  pvVar5 = __ckd_realloc__(*(void **)&base[1].n_1g_alloc,(long)iVar8 << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x21a);
  *(void **)&base[1].n_1g_alloc = pvVar5;
  pcVar6 = __ckd_salloc__(name,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                          ,0x21b);
  iVar8 = base[1].refcount;
  lVar9 = (long)iVar8;
  *(char **)(*(long *)&base[1].n_1g_alloc + -8 + lVar9 * 8) = pcVar6;
  if (base->n < model->n) {
    base->n = model->n;
    pvVar5 = __ckd_realloc__(*(void **)&base[1].lw,(ulong)model->n * 4 - 4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                             ,0x220);
    *(void **)&base[1].lw = pvVar5;
    iVar8 = base[1].refcount;
    lVar9 = (long)iVar8;
  }
  pvVar5 = __ckd_realloc__(*(void **)&base[1].n,lVar9 << 2,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x226);
  *(void **)&base[1].n = pvVar5;
  iVar2 = logmath_log(base->lmath,(float64)(double)((float)weight / (float)iVar8));
  *(int *)(*(long *)&base[1].n + -4 + (long)base[1].refcount * 4) = iVar2;
  iVar2 = logmath_log(base->lmath,(float64)(1.0 - (double)((float)weight / (float)iVar8)));
  iVar8 = base[1].refcount;
  if (1 < iVar8) {
    lVar9 = *(long *)&base[1].n;
    lVar10 = 0;
    do {
      piVar1 = (int *)(lVar9 + lVar10 * 4);
      *piVar1 = *piVar1 + iVar2;
      lVar10 = lVar10 + 1;
      iVar8 = base[1].refcount;
    } while (lVar10 < (long)iVar8 + -1);
  }
  if (reuse_widmap == 0) {
    build_widmap(base,base->lmath,(uint)base->n);
  }
  else {
    plVar7 = (logmath_t *)
             __ckd_calloc_2d__((long)base->n_words,(long)iVar8,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                               ,0x235);
    if (0 < base->n_words) {
      lVar9 = 0;
      do {
        memcpy((&(plVar7->t).table)[lVar9],(&((base[1].lmath)->t).table)[lVar9],
               (long)base[1].refcount * 4 - 4);
        iVar3 = ngram_wid(model,base->word_str[lVar9]);
        *(int32 *)((long)(&(plVar7->t).table)[lVar9] + (long)base[1].refcount * 4 + -4) = iVar3;
        lVar9 = lVar9 + 1;
      } while (lVar9 < base->n_words);
    }
    ckd_free_2d(base[1].lmath);
    base[1].lmath = plVar7;
  }
  return model;
}

Assistant:

ngram_model_t *
ngram_model_set_add(ngram_model_t * base,
                    ngram_model_t * model,
                    const char *name, float32 weight, int reuse_widmap)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    float32 fprob;
    int32 scale, i;

    /* Add it to the array of lms. */
    ++set->n_models;
    set->lms = ckd_realloc(set->lms, set->n_models * sizeof(*set->lms));
    set->lms[set->n_models - 1] = model;
    set->names =
        ckd_realloc(set->names, set->n_models * sizeof(*set->names));
    set->names[set->n_models - 1] = ckd_salloc(name);
    /* Expand the history mapping table if necessary. */
    if (model->n > base->n) {
        base->n = model->n;
        set->maphist = ckd_realloc(set->maphist,
                                   (model->n - 1) * sizeof(*set->maphist));
    }

    /* Renormalize the interpolation weights. */
    fprob = weight * 1.0f / set->n_models;
    set->lweights = ckd_realloc(set->lweights,
                                set->n_models * sizeof(*set->lweights));
    set->lweights[set->n_models - 1] = logmath_log(base->lmath, fprob);
    /* Now normalize everything else to fit it in.  This is
     * accomplished by simply scaling all the other probabilities
     * by (1-fprob). */
    scale = logmath_log(base->lmath, 1.0 - fprob);
    for (i = 0; i < set->n_models - 1; ++i)
        set->lweights[i] += scale;

    /* Reuse the old word ID mapping if requested. */
    if (reuse_widmap) {
        int32 **new_widmap;

        /* Tack another column onto the widmap array. */
        new_widmap = (int32 **) ckd_calloc_2d(base->n_words, set->n_models,
                                              sizeof(**new_widmap));
        for (i = 0; i < base->n_words; ++i) {
            /* Copy all the existing mappings. */
            memcpy(new_widmap[i], set->widmap[i],
                   (set->n_models - 1) * sizeof(**new_widmap));
            /* Create the new mapping. */
            new_widmap[i][set->n_models - 1] =
                ngram_wid(model, base->word_str[i]);
        }
        ckd_free_2d((void **) set->widmap);
        set->widmap = new_widmap;
    }
    else {
        build_widmap(base, base->lmath, base->n);
    }
    return model;
}